

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

bool __thiscall
Inline::InlineApplyScriptTarget
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlinerData,
          FunctionJITTimeInfo **pInlineeData,FunctionJITTimeInfo *applyFuncInfo,
          StackSym *symCallerThis,Instr **returnInstr,uint recursiveInlineDepth,
          bool isArrayOpndArgumentsObject,uint argsCount)

{
  code *pcVar1;
  anon_class_24_3_71b5c251 callback;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  JITTimeFunctionBody *pJVar5;
  char16 *pcVar6;
  char16 *pcVar7;
  char16 *pcVar8;
  char16 *pcVar9;
  Opnd *pOVar10;
  Instr *pIVar11;
  undefined4 *puVar12;
  RegOpnd *pRVar13;
  StackSym *pSVar14;
  Instr *pIVar15;
  BailOutInstrTemplate<IR::Instr> *this_00;
  ByteCodeUsesInstr *this_01;
  IntConstOpnd *pIVar16;
  Instr *byteCodeArgOutUse;
  Opnd *argSrc1;
  ByteCodeUsesInstr *bytecodeUses;
  Instr *bailOutOnNotStackArgs;
  Instr *argObjByteCodeArgoutCapture;
  Instr *startCall;
  Instr *byteCodeArgOutCapture;
  Instr *local_160;
  Instr *argumentsObjArgOut;
  Instr *explicitThisArgOut;
  Instr *implicitThisArgOut;
  bool safeThis;
  StackSym *pSStack_140;
  bool originalCallTargetOpndIsJITOpt;
  StackSym *originalCallTargetStackSym;
  bool targetIsCallback;
  Instr *pIStack_130;
  CallApplyTargetSourceType targetType;
  Instr *callbackDefInstr;
  FunctionJITTimeInfo *pFStack_120;
  InlineCacheIndex inlineCacheIndex;
  FunctionJITTimeInfo *inlineeData;
  Instr *applyTargetLdInstr;
  Instr *applyLdInstr;
  char16 debugStringBuffer2 [42];
  wchar local_a8 [4];
  char16 debugStringBuffer [42];
  bool isArrayOpndArgumentsObject_local;
  StackSym *symCallerThis_local;
  FunctionJITTimeInfo *applyFuncInfo_local;
  FunctionJITTimeInfo **pInlineeData_local;
  FunctionJITTimeInfo *inlinerData_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  debugStringBuffer[0x27]._1_1_ = isArrayOpndArgumentsObject;
  unique0x10000be4 = symCallerThis;
  if ((this->isApplyTargetInliningInProgress & 1U) == 0) {
    applyTargetLdInstr = (Instr *)0x0;
    inlineeData = (FunctionJITTimeInfo *)0x0;
    bVar2 = TryGetCallApplyAndTargetLdInstrs
                      (this,callInstr,&applyTargetLdInstr,(Instr **)&inlineeData);
    if (bVar2) {
      pFStack_120 = (FunctionJITTimeInfo *)0x0;
      callbackDefInstr._4_4_ = 0xffffffff;
      pIStack_130 = (Instr *)0x0;
      originalCallTargetStackSym._7_1_ = None;
      bVar2 = TryGetCallApplyInlineeData
                        (this,inlinerData,callInstr,applyTargetLdInstr,(Instr *)inlineeData,
                         &stack0xfffffffffffffee0,(InlineCacheIndex *)((long)&callbackDefInstr + 4),
                         &stack0xfffffffffffffed0,false,
                         (CallApplyTargetSourceType *)((long)&originalCallTargetStackSym + 7));
      if (bVar2) {
        if ((((debugStringBuffer[0x27]._1_1_ & 1) == 0) && (argsCount != 1)) ||
           (bVar2 = SkipCallApplyScriptTargetInlining_Shared
                              (this,callInstr,inlinerData,pFStack_120,true,false), bVar2)) {
          *pInlineeData = pFStack_120;
          this_local._7_1_ = false;
        }
        else {
          bVar2 = Func::IsTopFunc(callInstr->m_func);
          if (bVar2) {
            uVar3 = Func::GetSourceContextId(this->topFunc);
            uVar4 = Func::GetLocalFunctionId(this->topFunc);
            bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar3,uVar4);
            if (bVar2) {
              pJVar5 = FunctionJITTimeInfo::GetBody(inlinerData);
              pcVar6 = JITTimeFunctionBody::GetDisplayName(pJVar5);
              pcVar7 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_a8);
              pJVar5 = Func::GetJITFunctionBody(this->topFunc);
              pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar5);
              pcVar9 = Func::GetDebugNumberSet(this->topFunc,(wchar (*) [42])&applyLdInstr);
              Output::Print(L"INLINING: Skip Inline: Skipping apply target inlining in top func\tCaller: %s\t(%s) \tTop Func:%s\t(%s)\n"
                            ,pcVar6,pcVar7,pcVar8,pcVar9);
              Output::Flush();
            }
            this_local._7_1_ = false;
          }
          else {
            originalCallTargetStackSym._6_1_ = pIStack_130 != (Instr *)0x0;
            pOVar10 = IR::Instr::GetSrc1(callInstr);
            pSStack_140 = IR::Opnd::GetStackSym(pOVar10);
            pOVar10 = IR::Instr::GetSrc1(callInstr);
            implicitThisArgOut._7_1_ = IR::Opnd::GetIsJITOptimizedReg(pOVar10);
            implicitThisArgOut._6_1_ = 0;
            pIVar11 = TryGetFixedMethodsForBuiltInAndTarget
                                (this,callInstr,inlinerData,pFStack_120,applyFuncInfo,
                                 applyTargetLdInstr,(Instr *)inlineeData,
                                 (bool *)((long)&implicitThisArgOut + 6),true,
                                 (bool)(originalCallTargetStackSym._6_1_ & 1));
            if (pIVar11 == (Instr *)0x0) {
              this_local._7_1_ = false;
            }
            else {
              explicitThisArgOut = (Instr *)0x0;
              argumentsObjArgOut = (Instr *)0x0;
              local_160 = (Instr *)0x0;
              callback.explicitThisArgOut._0_4_ = (int)&argumentsObjArgOut;
              callback.argumentsObjArgOut = &local_160;
              callback.explicitThisArgOut._4_4_ = (int)((ulong)&argumentsObjArgOut >> 0x20);
              callback.implicitThisArgOut._0_4_ = (int)&explicitThisArgOut;
              callback.implicitThisArgOut._4_4_ = (int)((ulong)&explicitThisArgOut >> 0x20);
              IR::Instr::
              IterateArgInstrs<Inline::InlineApplyScriptTarget(IR::Instr*,FunctionJITTimeInfo_const*,FunctionJITTimeInfo_const**,FunctionJITTimeInfo_const*,StackSym_const*,IR::Instr**,unsigned_int,bool,unsigned_int)::__0>
                        (callInstr,callback);
              bVar2 = HasArgumentsAccess(this,argumentsObjArgOut);
              if (!bVar2) {
                Func::SetApplyTargetInliningRemovedArgumentsAccess(callInstr->m_func);
              }
              if ((implicitThisArgOut._6_1_ & 1) != 0) {
                pIVar11 = IR::Instr::GetBytecodeArgOutCapture(argumentsObjArgOut);
                pOVar10 = IR::Instr::GetSrc1(pIVar11);
                bVar2 = IR::Opnd::IsRegOpnd(pOVar10);
                if (!bVar2) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar12 = 1;
                  bVar2 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                     ,0xbf2,"(byteCodeArgOutCapture->GetSrc1()->IsRegOpnd())",
                                     "byteCodeArgOutCapture->GetSrc1()->IsRegOpnd()");
                  if (!bVar2) {
                    pcVar1 = (code *)invalidInstructionException();
                    (*pcVar1)();
                  }
                  puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar12 = 0;
                }
                pOVar10 = IR::Instr::GetSrc1(pIVar11);
                pRVar13 = IR::Opnd::AsRegOpnd(pOVar10);
                pSVar14 = IR::Opnd::GetStackSym(&pRVar13->super_Opnd);
                if (pSVar14 != stack0xffffffffffffffb0) {
                  implicitThisArgOut._6_1_ = 0;
                }
              }
              pOVar10 = IR::Instr::GetSrc2(explicitThisArgOut);
              bVar2 = IR::Opnd::IsRegOpnd(pOVar10);
              if (!bVar2) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar12 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                   ,0xbfa,"(implicitThisArgOut->GetSrc2()->IsRegOpnd())",
                                   "implicitThisArgOut->GetSrc2()->IsRegOpnd()");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar12 = 0;
              }
              pOVar10 = IR::Instr::GetSrc2(explicitThisArgOut);
              pRVar13 = IR::Opnd::AsRegOpnd(pOVar10);
              pSVar14 = Sym::AsStackSym(&pRVar13->m_sym->super_Sym);
              pIVar11 = StackSym::GetInstrDef(pSVar14);
              if (pIVar11->m_opcode != StartCall) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar12 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                   ,0xbfc,"(startCall->m_opcode == Js::OpCode::StartCall)",
                                   "startCall->m_opcode == Js::OpCode::StartCall");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar12 = 0;
              }
              if (local_160 != (Instr *)0x0) {
                if (argsCount != 2) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar12 = 1;
                  bVar2 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                     ,0xc00,"(argsCount == 2)","argsCount == 2");
                  if (!bVar2) {
                    pcVar1 = (code *)invalidInstructionException();
                    (*pcVar1)();
                  }
                  puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar12 = 0;
                }
                pIVar15 = IR::Instr::GetBytecodeArgOutCapture(local_160);
                pOVar10 = IR::Instr::GetDst(pIVar15);
                pSVar14 = IR::Opnd::GetStackSym(pOVar10);
                *(uint *)&pSVar14->field_0x18 =
                     *(uint *)&pSVar14->field_0x18 & 0xfbffffff | 0x4000000;
                local_160->m_opcode = ArgOut_A_FromStackArgs;
                this_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                                    (BailOnNotStackArgs,BailOutOnInlineFunction,callInstr,
                                     callInstr->m_func);
                pOVar10 = IR::Instr::GetSrc1(local_160);
                pOVar10 = IR::Opnd::Copy(pOVar10,this->topFunc);
                IR::Instr::SetSrc1(&this_00->super_Instr,pOVar10);
                IR::Instr::InsertBefore(local_160,&this_00->super_Instr);
                this_01 = IR::ByteCodeUsesInstr::New(callInstr);
                pOVar10 = IR::Instr::GetSrc1(pIVar15);
                bVar2 = IR::Opnd::GetIsJITOptimizedReg(pOVar10);
                pSVar14 = IR::Opnd::GetStackSym(pOVar10);
                IR::ByteCodeUsesInstr::SetRemovedOpndSymbol(this_01,bVar2,(pSVar14->super_Sym).m_id)
                ;
                IR::Instr::InsertBefore(callInstr,&this_01->super_Instr);
              }
              pIVar15 = IR::Instr::New(BytecodeArgOutUse,callInstr->m_func);
              pOVar10 = IR::Instr::GetSrc1(explicitThisArgOut);
              IR::Instr::SetSrc1(pIVar15,pOVar10);
              IR::Instr::InsertBefore(callInstr,pIVar15);
              if (local_160 != (Instr *)0x0) {
                pIVar15 = IR::Instr::New(BytecodeArgOutUse,callInstr->m_func);
                pOVar10 = IR::Instr::GetSrc1(local_160);
                IR::Instr::SetSrc1(pIVar15,pOVar10);
                IR::Instr::InsertBefore(callInstr,pIVar15);
              }
              pIVar15 = argumentsObjArgOut;
              pOVar10 = IR::Instr::GetDst(pIVar11);
              IR::Instr::ReplaceSrc2(pIVar15,pOVar10);
              IR::Instr::Remove(explicitThisArgOut);
              uVar3 = IR::Instr::GetArgOutCount(pIVar11,false);
              pIVar16 = IR::IntConstOpnd::New((ulong)uVar3,TyUint32,pIVar11->m_func,false);
              IR::Instr::SetSrc2(pIVar11,&pIVar16->super_Opnd);
              pOVar10 = IR::Instr::GetSrc1(pIVar11);
              pIVar16 = IR::Opnd::AsIntConstOpnd(pOVar10);
              IR::IntConstOpnd::IncrValue(pIVar16,-1);
              pIVar11 = InlineCallApplyTarget_Shared
                                  (this,callInstr,(bool)(implicitThisArgOut._7_1_ & 1),pSStack_140,
                                   pFStack_120,callbackDefInstr._4_4_,
                                   (bool)(implicitThisArgOut._6_1_ & 1),true,
                                   originalCallTargetStackSym._7_1_,pIStack_130,recursiveInlineDepth
                                   ,callInstr);
              *returnInstr = pIVar11;
              this_local._7_1_ = true;
            }
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    uVar3 = Func::GetSourceContextId(this->topFunc);
    uVar4 = Func::GetLocalFunctionId(this->topFunc);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar3,uVar4);
    if (bVar2) {
      pJVar5 = FunctionJITTimeInfo::GetBody(inlinerData);
      pcVar6 = JITTimeFunctionBody::GetDisplayName(pJVar5);
      pcVar7 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_a8);
      pJVar5 = Func::GetJITFunctionBody(this->topFunc);
      pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar5);
      pcVar9 = Func::GetDebugNumberSet(this->topFunc,(wchar (*) [42])&applyLdInstr);
      Output::Print(L"INLINING: Skip Inline: Skipping apply target inlining, Recursive apply inlining is not supported \tCaller: %s\t(%s) \tTop Func:%s\t(%s)\n"
                    ,pcVar6,pcVar7,pcVar8,pcVar9);
      Output::Flush();
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Inline::InlineApplyScriptTarget(IR::Instr *callInstr, const FunctionJITTimeInfo* inlinerData, const FunctionJITTimeInfo** pInlineeData, const FunctionJITTimeInfo *applyFuncInfo,
                            const StackSym *symCallerThis, IR::Instr ** returnInstr, uint recursiveInlineDepth, bool isArrayOpndArgumentsObject, uint argsCount)
{
#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

    if (this->isApplyTargetInliningInProgress)
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: Skipping apply target inlining, Recursive apply inlining is not supported \tCaller: %s\t(%s) \tTop Func:%s\t(%s)\n"), inlinerData->GetBody()->GetDisplayName(),
                                inlinerData->GetDebugNumberSet(debugStringBuffer), this->topFunc->GetJITFunctionBody()->GetDisplayName(), this->topFunc->GetDebugNumberSet(debugStringBuffer2));
        return false;
    }

    // Begin inlining apply target

    IR::Instr* applyLdInstr = nullptr;
    IR::Instr* applyTargetLdInstr = nullptr;
    if (!TryGetCallApplyAndTargetLdInstrs(callInstr, &applyLdInstr, &applyTargetLdInstr))
    {
        return false;
    }

    const FunctionJITTimeInfo * inlineeData = nullptr;
    Js::InlineCacheIndex inlineCacheIndex = Js::Constants::NoInlineCacheIndex;
    IR::Instr * callbackDefInstr = nullptr;
    CallApplyTargetSourceType targetType = CallApplyTargetSourceType::None;
    if (!TryGetCallApplyInlineeData(inlinerData, callInstr, applyLdInstr, applyTargetLdInstr, &inlineeData, &inlineCacheIndex, &callbackDefInstr, false, &targetType))
    {
        return false;
    }

    if ((!isArrayOpndArgumentsObject && (argsCount != 1)) || SkipCallApplyScriptTargetInlining_Shared(callInstr, inlinerData, inlineeData, /*isApplyTarget*/ true, /*isCallTarget*/ false))
    {
        *pInlineeData = inlineeData;
        return false;
    }

    if (callInstr->m_func->IsTopFunc())
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: Skipping apply target inlining in top func\tCaller: %s\t(%s) \tTop Func:%s\t(%s)\n"), inlinerData->GetBody()->GetDisplayName(),
            inlinerData->GetDebugNumberSet(debugStringBuffer), this->topFunc->GetJITFunctionBody()->GetDisplayName(), this->topFunc->GetDebugNumberSet(debugStringBuffer2));
        return false;
    }

    const bool targetIsCallback = callbackDefInstr != nullptr;

    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();
    bool safeThis = false;

    if (!TryGetFixedMethodsForBuiltInAndTarget(callInstr, inlinerData, inlineeData, applyFuncInfo, applyLdInstr, applyTargetLdInstr, safeThis, /*isApplyTarget*/ true, targetIsCallback))
    {
        return false;
    }

    // o.foo.apply(obj[, arguments])
    //
    // StartCall
    // ArgOut_A         <-- implicit "this" (foo) argout
    // ArgOut_A         <-- explicit "this" (obj) argout
    // ArgOut_A         <-- arguments object argout
    // CallIFixed

    IR::Instr* implicitThisArgOut = nullptr;
    IR::Instr* explicitThisArgOut = nullptr;
    IR::Instr* argumentsObjArgOut = nullptr;
    callInstr->IterateArgInstrs([&](IR::Instr* argInstr)
    {
        argumentsObjArgOut = explicitThisArgOut;
        explicitThisArgOut = implicitThisArgOut;
        implicitThisArgOut = argInstr;

        argInstr->GenerateBytecodeArgOutCapture(); // Generate BytecodeArgOutCapture here to capture the implicit "this" (to be removed) and arguments object (to be expanded) argouts,
                                                   // so that any bailout in the call sequence restores the argouts stack as the interpreter would expect it to be.
        argInstr->GetDst()->AsSymOpnd()->GetStackSym()->DecrementArgSlotNum(); // We will be removing implicit "this" argout
        return false;
    });

    // If the arguments object was passed in as the first argument to apply,
    // 'arguments' access continues to exist even after apply target inlining
    if (!HasArgumentsAccess(explicitThisArgOut))
    {
        callInstr->m_func->SetApplyTargetInliningRemovedArgumentsAccess();
    }

    if (safeThis)
    {
        IR::Instr * byteCodeArgOutCapture = explicitThisArgOut->GetBytecodeArgOutCapture();
        Assert(byteCodeArgOutCapture->GetSrc1()->IsRegOpnd());

        if (byteCodeArgOutCapture->GetSrc1()->AsRegOpnd()->GetStackSym() != symCallerThis)
        {
            safeThis = false;
        }
    }

    Assert(implicitThisArgOut->GetSrc2()->IsRegOpnd());
    IR::Instr * startCall = implicitThisArgOut->GetSrc2()->AsRegOpnd()->m_sym->AsStackSym()->GetInstrDef();
    Assert(startCall->m_opcode == Js::OpCode::StartCall);

    if (argumentsObjArgOut)
    {
        Assert(argsCount == 2);
        IR::Instr* argObjByteCodeArgoutCapture = argumentsObjArgOut->GetBytecodeArgOutCapture();
        argObjByteCodeArgoutCapture->GetDst()->GetStackSym()->m_nonEscapingArgObjAlias = true;

        argumentsObjArgOut->m_opcode = Js::OpCode::ArgOut_A_FromStackArgs;

        IR::Instr *  bailOutOnNotStackArgs = IR::BailOutInstr::New(Js::OpCode::BailOnNotStackArgs, IR::BailOutOnInlineFunction,
            callInstr, callInstr->m_func);
        // set src1 to avoid CSE on BailOnNotStackArgs for different arguments object
        bailOutOnNotStackArgs->SetSrc1(argumentsObjArgOut->GetSrc1()->Copy(this->topFunc));
        argumentsObjArgOut->InsertBefore(bailOutOnNotStackArgs);

        // Insert ByteCodeUses instr to ensure that arguments object is available on bailout
        IR::ByteCodeUsesInstr* bytecodeUses = IR::ByteCodeUsesInstr::New(callInstr);
        IR::Opnd* argSrc1 = argObjByteCodeArgoutCapture->GetSrc1();
        bytecodeUses->SetRemovedOpndSymbol(argSrc1->GetIsJITOptimizedReg(), argSrc1->GetStackSym()->m_id);
        callInstr->InsertBefore(bytecodeUses);
    }

    IR::Instr* byteCodeArgOutUse = IR::Instr::New(Js::OpCode::BytecodeArgOutUse, callInstr->m_func);
    byteCodeArgOutUse->SetSrc1(implicitThisArgOut->GetSrc1());
    callInstr->InsertBefore(byteCodeArgOutUse);
    if (argumentsObjArgOut)
    {
        byteCodeArgOutUse = IR::Instr::New(Js::OpCode::BytecodeArgOutUse, callInstr->m_func);
        byteCodeArgOutUse->SetSrc1(argumentsObjArgOut->GetSrc1());
        callInstr->InsertBefore(byteCodeArgOutUse);
    }

    // don't need the implicit "this" anymore
    explicitThisArgOut->ReplaceSrc2(startCall->GetDst());
    implicitThisArgOut->Remove();

    startCall->SetSrc2(IR::IntConstOpnd::New(startCall->GetArgOutCount(/*getInterpreterArgOutCount*/ false), TyUint32, startCall->m_func));
    startCall->GetSrc1()->AsIntConstOpnd()->IncrValue(-1); // update the count of argouts as seen by JIT, in the start call instruction

    *returnInstr = InlineCallApplyTarget_Shared(callInstr, originalCallTargetOpndIsJITOpt, originalCallTargetStackSym, inlineeData, inlineCacheIndex,
                                                safeThis, /*isApplyTarget*/ true, targetType, callbackDefInstr, recursiveInlineDepth, callInstr);
    return true;
}